

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O0

prsndef * prsxatm(prscxdef *ctx)

{
  int *piVar1;
  errcxdef *ctx_00;
  long in_RDI;
  prpnum pr;
  tokdef newtok;
  tokdef *tok;
  prsndef *n;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  prscxdef *in_stack_ffffffffffffffd0;
  prsndef *local_18;
  prsndef *local_8;
  
  piVar1 = (int *)(*(long *)(in_RDI + 8) + 0x120);
  ctx_00 = (errcxdef *)(ulong)(*piVar1 - 0xe);
  switch(ctx_00) {
  case (errcxdef *)0x0:
  case (errcxdef *)0x47:
    toknext((tokcxdef *)newtok._0_8_);
    if ((*(int *)(*(long *)(in_RDI + 8) + 0x120) == 0x38) &&
       ((*(char *)(*(long *)(in_RDI + 8) + 0x160) == '\b' ||
        (*(char *)(*(long *)(in_RDI + 8) + 0x160) == '\x01')))) {
      local_8 = prsnew0((prscxdef *)ctx_00,
                        (tokdef *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      toknext((tokcxdef *)newtok._0_8_);
    }
    else {
      prsrqpr((prscxdef *)ctx_00);
      local_8 = prsnew0((prscxdef *)ctx_00,
                        (tokdef *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    }
    break;
  default:
    errsigf(ctx_00,(char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0);
  case (errcxdef *)0x24:
    toknext((tokcxdef *)newtok._0_8_);
    local_8 = prsxexp((prscxdef *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                      in_stack_ffffffffffffff6c);
    prsreq((prscxdef *)ctx_00,in_stack_ffffffffffffff5c);
    break;
  case (errcxdef *)0x27:
  case (errcxdef *)0x28:
  case (errcxdef *)0x29:
  case (errcxdef *)0x3f:
  case (errcxdef *)0x40:
    local_8 = prsnew0((prscxdef *)ctx_00,
                      (tokdef *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    toknext((tokcxdef *)newtok._0_8_);
    break;
  case (errcxdef *)0x2a:
    local_18 = prsnew0((prscxdef *)ctx_00,
                       (tokdef *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    toknext((tokcxdef *)newtok._0_8_);
    if (((local_18->prsnv).prsnvt.toksym.tokstyp == '\t') && (*piVar1 == 0x38)) {
      prsnew0((prscxdef *)ctx_00,
              (tokdef *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      local_18 = prsnew1((prscxdef *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                         in_stack_ffffffffffffff6c,(prsndef *)ctx_00);
      toknext((tokcxdef *)newtok._0_8_);
    }
    local_8 = local_18;
    break;
  case (errcxdef *)0x2c:
    toknext((tokcxdef *)newtok._0_8_);
    local_8 = prslst(in_stack_ffffffffffffffd0);
  }
  return local_8;
}

Assistant:

static prsndef *prsxatm(prscxdef *ctx)
{
    prsndef *n;
    tokdef  *tok = &ctx->prscxtok->tokcxcur;
    tokdef   newtok;
    prpnum   pr;
    
    switch(tok->toktyp)
    {
    case TOKTPOUND:
    case TOKTBAND:
        toknext(ctx->prscxtok);
        if (ctx->prscxtok->tokcxcur.toktyp == TOKTSYMBOL &&
            (ctx->prscxtok->tokcxcur.toksym.tokstyp == TOKSTFWDFN ||
             ctx->prscxtok->tokcxcur.toksym.tokstyp == TOKSTFUNC))
        {
            n = prsnew0(ctx, tok);
            toknext(ctx->prscxtok);
            return(n);
        }
        else
        {
            pr = prsrqpr(ctx);
            newtok.toktyp = TOKTPOUND;
            newtok.tokofs = pr;
            return(prsnew0(ctx, &newtok));
        }
        
    case TOKTLPAR:
        toknext(ctx->prscxtok);
        n = prsxexp(ctx, FALSE);
        prsreq(ctx, TOKTRPAR);
        return(n);
        
    case TOKTLBRACK:
        toknext(ctx->prscxtok);
        return(prslst(ctx));
        
    case TOKTNUMBER:
    case TOKTNIL:
    case TOKTTRUE:
    case TOKTSSTRING:
    case TOKTDSTRING:
        /* create and return a new terminal node for this item */
        n = prsnew0(ctx, tok);
        toknext(ctx->prscxtok);
        return n;
        
    case TOKTSYMBOL:
        /* create a new terminal node for the symbol */
        n = prsnew0(ctx, tok);
        toknext(ctx->prscxtok);

        /* 
         *   if it was 'inherited', and there's another symbol name
         *   following, we have the explicit superclass notation - parse
         *   it 
         */
        if (n->prsnv.prsnvt.toksym.tokstyp == TOKSTINHERIT
            && tok->toktyp == TOKTSYMBOL)
        {
            /* build a new node for the explicit superclass */
            n = prsnew0(ctx, tok);

            /* build a containing node for the inheritance operator */
            n = prsnew1(ctx, TOKTEXPINH, n);

            /* skip the superclass name token */
            toknext(ctx->prscxtok);
        }

        /* return the new node */
        return n;
        
    default:
        errsig(ctx->prscxerr, ERR_REQOPN);
        return 0;
        NOTREACHEDV(prsndef *);
    }
}